

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_of_12,int a_max_of_12)

{
  ImVector<ImVec2> *this_00;
  ImVec2 IVar1;
  int a;
  ImVec2 local_38;
  
  this_00 = &this->_Path;
  if ((radius == 0.0) && (!NAN(radius))) {
    ImVector<ImVec2>::push_back(this_00,center);
    return;
  }
  ImVector<ImVec2>::reserve(this_00,(a_max_of_12 - a_min_of_12) + (this->_Path).Size + 1);
  for (; a_min_of_12 <= a_max_of_12; a_min_of_12 = a_min_of_12 + 1) {
    IVar1 = this->_Data->ArcFastVtx[a_min_of_12 % 0xc];
    local_38.x = IVar1.x * radius + (*center).x;
    local_38.y = IVar1.y * radius + (*center).y;
    ImVector<ImVec2>::push_back(this_00,&local_38);
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& center, float radius, int a_min_of_12, int a_max_of_12)
{
    if (radius == 0.0f)
    {
        _Path.push_back(center);
        return;
    }
    IM_ASSERT(a_min_of_12 <= a_max_of_12);

    // For legacy reason the PathArcToFast() always takes angles where 2*PI is represented by 12,
    // but it is possible to set IM_DRAWLIST_ARCFAST_TESSELATION_MULTIPLIER to a higher value. This should compile to a no-op otherwise.
#if IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER != 1
    a_min_of_12 *= IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER;
    a_max_of_12 *= IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER;
#endif

    _Path.reserve(_Path.Size + (a_max_of_12 - a_min_of_12 + 1));
    for (int a = a_min_of_12; a <= a_max_of_12; a++)
    {
        const ImVec2& c = _Data->ArcFastVtx[a % IM_ARRAYSIZE(_Data->ArcFastVtx)];
        _Path.push_back(ImVec2(center.x + c.x * radius, center.y + c.y * radius));
    }
}